

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

void __thiscall
gnuplotio::PlotGroup::
add<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,gnuplotio::Mode1DUnwrap>
          (PlotGroup *this,string *arg,string *plotspec,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *text_array_record)

{
  bool bVar1;
  logic_error *this_00;
  ModeBinary local_81;
  Mode1DUnwrap local_80;
  ModeText local_7f;
  Mode1DUnwrap local_7e;
  undefined1 local_7d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  string *text_array_record_local;
  string *plotspec_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *arg_local;
  PlotGroup *this_local;
  
  local_30 = text_array_record;
  text_array_record_local = plotspec;
  plotspec_local = arg;
  arg_local = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)this;
  bVar1 = std::operator==(text_array_record,"text");
  if (!bVar1) {
    bVar1 = std::operator==(local_30,"array");
    if (!bVar1) {
      bVar1 = std::operator==(local_30,"record");
      if (!bVar1) {
        local_7d = 1;
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_70,"text_array_record must be one of text, array, or record (was ",
                       local_30);
        std::operator+(&local_50,&local_70,")");
        std::logic_error::logic_error(this_00,(string *)&local_50);
        local_7d = 0;
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
  }
  bVar1 = std::operator==(local_30,"text");
  if (bVar1) {
    std::vector<gnuplotio::PlotData,std::allocator<gnuplotio::PlotData>>::
    emplace_back<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>const&,std::__cxx11::string_const&,char_const(&)[6],gnuplotio::Mode1DUnwrap,gnuplotio::ModeText>
              ((vector<gnuplotio::PlotData,std::allocator<gnuplotio::PlotData>> *)&this->plots,
               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)plotspec_local,text_array_record_local,(char (*) [6])"array",&local_7e,&local_7f);
  }
  else {
    std::vector<gnuplotio::PlotData,std::allocator<gnuplotio::PlotData>>::
    emplace_back<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,gnuplotio::Mode1DUnwrap,gnuplotio::ModeBinary>
              ((vector<gnuplotio::PlotData,std::allocator<gnuplotio::PlotData>> *)&this->plots,
               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)plotspec_local,text_array_record_local,local_30,&local_80,&local_81);
  }
  return;
}

Assistant:

void add(const T &arg, const std::string &plotspec, const std::string &text_array_record, OrganizationMode) {
        if(!(
            text_array_record == "text" ||
            text_array_record == "array" ||
            text_array_record == "record"
        )) throw std::logic_error("text_array_record must be one of text, array, or record (was "+
            text_array_record+")");

        if(text_array_record == "text") {
            plots.emplace_back(arg, plotspec,
                "array", // arbitrary value
                OrganizationMode(), ModeText());
        } else {
            plots.emplace_back(arg, plotspec, text_array_record,
                OrganizationMode(), ModeBinary());
        }
    }